

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  GeneratorOptions *options_00;
  CppType CVar1;
  LogMessage *other;
  Descriptor *from_file;
  Descriptor *in_R8;
  LogFinisher local_59;
  LogMessage local_58;
  
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)options);
  if (CVar1 != CPPTYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0xff);
    other = internal::LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE: ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  options_00 = (GeneratorOptions *)(options->namespace_prefix)._M_string_length;
  from_file = FieldDescriptor::message_type((FieldDescriptor *)options);
  MaybeCrossFileRef_abi_cxx11_
            (__return_storage_ptr__,this,options_00,(FileDescriptor *)from_file,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string SubmessageTypeRef(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  GOOGLE_CHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  return MaybeCrossFileRef(options, field->file(), field->message_type());
}